

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O1

void Ivy_CutCompactAll(Ivy_Store_t *pCutStore)

{
  Ivy_Cut_t *pIVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int *piVar4;
  int iVar5;
  short sVar6;
  short sVar7;
  short *psVar8;
  int iVar9;
  long lVar10;
  
  pCutStore->nCutsM = 0;
  if (pCutStore->nCuts < 1) {
    iVar9 = 0;
  }
  else {
    psVar8 = &pCutStore->pCuts[0].nSizeMax;
    lVar10 = 0;
    iVar9 = 0;
    do {
      if (psVar8[-1] != 0) {
        if (psVar8[-1] < *psVar8) {
          pCutStore->nCutsM = pCutStore->nCutsM + 1;
        }
        pIVar1 = (Ivy_Cut_t *)(psVar8 + -3);
        pCutStore->pCuts[iVar9].uHash = *(uint *)(psVar8 + 0xd);
        iVar5 = pIVar1->nLatches;
        sVar6 = pIVar1->nSize;
        sVar7 = pIVar1->nSizeMax;
        uVar2 = *(undefined8 *)(psVar8 + 1);
        uVar3 = *(undefined8 *)(psVar8 + 9);
        piVar4 = pCutStore->pCuts[iVar9].pArray;
        *(undefined8 *)(piVar4 + 2) = *(undefined8 *)(psVar8 + 5);
        *(undefined8 *)(piVar4 + 4) = uVar3;
        pIVar1 = pCutStore->pCuts + iVar9;
        pIVar1->nLatches = iVar5;
        pIVar1->nSize = sVar6;
        pIVar1->nSizeMax = sVar7;
        *(undefined8 *)pIVar1->pArray = uVar2;
        iVar9 = iVar9 + 1;
      }
      lVar10 = lVar10 + 1;
      psVar8 = psVar8 + 0x12;
    } while (lVar10 < pCutStore->nCuts);
  }
  pCutStore->nCuts = iVar9;
  return;
}

Assistant:

void Ivy_CutCompactAll( Ivy_Store_t * pCutStore )
{
    Ivy_Cut_t * pCut;
    int i, k;
    pCutStore->nCutsM = 0;
    for ( i = k = 0; i < pCutStore->nCuts; i++ )
    {
        pCut = pCutStore->pCuts + i;
        if ( pCut->nSize == 0 )
            continue;
        if ( pCut->nSize < pCut->nSizeMax )
            pCutStore->nCutsM++;
        pCutStore->pCuts[k++] = *pCut;
    }
    pCutStore->nCuts = k;
}